

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O2

ssize_t __thiscall kj::FdOutputStream::write(FdOutputStream *this,int __fd,void *__buf,size_t __n)

{
  size_t *psVar1;
  uint uVar2;
  int code;
  iovec *piVar3;
  void *pvVar4;
  ssize_t extraout_RAX;
  iovec *piVar5;
  undefined4 in_register_00000034;
  long lVar6;
  long lVar7;
  iovec *__iovec;
  ssize_t n;
  Fault f_1;
  Array<iovec> iov_heap;
  Fault f;
  iovec iov_stack [16];
  
  lVar6 = CONCAT44(in_register_00000034,__fd);
  lVar7 = (long)__buf * -0x10;
  for (; (void *)0x400 < __buf; __buf = (void *)((long)__buf + -0x400)) {
    (*(this->super_OutputStream)._vptr_OutputStream[3])(this,lVar6,0x400);
    lVar6 = lVar6 + 0x4000;
    lVar7 = lVar7 + 0x4000;
  }
  if (__buf < (void *)0x11) {
    iov_heap.ptr = (iovec *)0x0;
    iov_heap.size_ = 0;
    iov_heap.disposer = (ArrayDisposer *)0x0;
    piVar3 = iov_stack;
  }
  else {
    piVar3 = _::HeapArrayDisposer::allocate<iovec>((size_t)__buf);
    iov_heap.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
    iov_heap.ptr = piVar3;
    iov_heap.size_ = (size_t)__buf;
  }
  for (uVar2 = 0; pvVar4 = (void *)(ulong)uVar2, pvVar4 < __buf; uVar2 = uVar2 + 1) {
    piVar3[(long)pvVar4].iov_base = *(void **)(lVar6 + (long)pvVar4 * 0x10);
    piVar3[(long)pvVar4].iov_len = *(size_t *)(lVar6 + 8 + (long)pvVar4 * 0x10);
  }
  piVar5 = (iovec *)((long)piVar3 - lVar7);
  for (__iovec = piVar3; (__iovec < piVar5 && (__iovec->iov_len == 0)); __iovec = __iovec + 1) {
  }
  do {
    if (piVar5 <= __iovec) {
      Array<iovec>::~Array(&iov_heap);
      return extraout_RAX;
    }
    n = 0;
    do {
      n = writev(this->fd,(iovec *)__iovec,
                 (int)((ulong)((long)piVar3 + (-(long)__iovec - lVar7)) >> 4));
      if (-1 < n) goto LAB_001602a2;
      code = _::Debug::getOsErrorNumber(false);
    } while (code == -1);
    if (code != 0) {
      _::Debug::Fault::Fault<int,int&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/io.c++"
                 ,0x1c3,code,"n = ::writev(fd, current, iovCount)","fd",&this->fd);
      _::Debug::Fault::fatal(&f);
    }
LAB_001602a2:
    if (n < 1) {
      f.exception = (Exception *)&n;
      _::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<long&,int>&,char_const(&)[24]>
                (&f_1,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/io.c++"
                 ,0x1c4,FAILED,"n > 0","_kjCondition,\"writev() returned zero.\"",
                 (DebugComparison<long_&,_int> *)&f,(char (*) [24])"writev() returned zero.");
      _::Debug::Fault::fatal(&f_1);
    }
    for (; (__iovec < piVar5 && (psVar1 = &__iovec->iov_len, *psVar1 <= (ulong)n));
        __iovec = __iovec + 1) {
      n = n - *psVar1;
    }
    f.exception = (Exception *)&n;
    if (0 < n) {
      __iovec->iov_base = (void *)((long)__iovec->iov_base + n);
      __iovec->iov_len = __iovec->iov_len - n;
      f.exception = (Exception *)&n;
    }
  } while( true );
}

Assistant:

void FdOutputStream::write(ArrayPtr<const ArrayPtr<const byte>> pieces) {
#if _WIN32
  // Windows has no reasonable writev(). It has WriteFileGather, but this call has the unreasonable
  // restriction that each segment must be page-aligned. So, fall back to the default implementation
  for (auto piece: pieces) write(piece);
#else
  const size_t iovmax = miniposix::iovMax();
  while (pieces.size() > iovmax) {
    write(pieces.first(iovmax));
    pieces = pieces.slice(iovmax, pieces.size());
  }

  KJ_STACK_ARRAY(struct iovec, iov, pieces.size(), 16, 128);

  for (uint i = 0; i < pieces.size(); i++) {
    // writev() interface is not const-correct.  :(
    iov[i].iov_base = const_cast<byte*>(pieces[i].begin());
    iov[i].iov_len = pieces[i].size();
  }

  struct iovec* current = iov.begin();

  // Advance past any leading empty buffers so that a write full of only empty buffers does not
  // cause a syscall at all.
  while (current < iov.end() && current->iov_len == 0) {
    ++current;
  }

  while (current < iov.end()) {
    size_t iovCount = iov.end() - current;

#if __APPLE__
    // MacOS will fail if you give it more than INT_MAX bytes to write at once. We can solve this
    // by carefully truncating the list to a lesser number. Why the OS doesn't just return a short
    // write itself, I don't know.
    size_t totalSize = 0;
    struct iovec* editedPiece = nullptr;
    size_t editedPieceOriginalLen = 0;
    for (auto i: kj::zeroTo(iovCount)) {
      auto& piece = *(current + i);
      totalSize += piece.iov_len;
      if (totalSize >= WRITE_CLAMP_SIZE) {
        // Truncate the list after this piece.
        iovCount = i + 1;

        if (totalSize > WRITE_CLAMP_SIZE) {
          // We also have to truncate this piece. Patch it in-place and plan to fix it later.
          editedPiece = &piece;
          editedPieceOriginalLen = piece.iov_len;
          size_t overage = totalSize - WRITE_CLAMP_SIZE;
          piece.iov_len -= overage;
        }

        break;
      }
    }
#endif

    // Issue the write.
    ssize_t n = 0;
    KJ_SYSCALL(n = ::writev(fd, current, iovCount), fd);
    KJ_ASSERT(n > 0, "writev() returned zero.");

#if __APPLE__
    // If we patched the list above, unpatch now.
    if (editedPiece != nullptr) {
      editedPiece->iov_len = editedPieceOriginalLen;
    }
#endif

    // Advance past all buffers that were fully-written.
    while (current < iov.end() && static_cast<size_t>(n) >= current->iov_len) {
      n -= current->iov_len;
      ++current;
    }

    // If we only partially-wrote one of the buffers, adjust the pointer and size to include only
    // the unwritten part.
    if (n > 0) {
      current->iov_base = reinterpret_cast<byte*>(current->iov_base) + n;
      current->iov_len -= n;
    }
  }
#endif
}